

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,char *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  string *this_00;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  bool bVar1;
  pointer in_stack_ffffffffffffff58;
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  TestResult *this_01;
  allocator local_4a;
  undefined1 local_49;
  string *local_48;
  allocator local_29;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  
  *in_RDI = &PTR__TestSuite_0019ec88;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_49 = 0;
  bVar1 = local_18 != (char *)0x0;
  if (bVar1) {
    this_00 = (string *)operator_new(0x20);
    local_49 = 1;
    local_48 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,local_18,&local_4a);
  }
  local_49 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)0x1203b6);
  this_01 = (TestResult *)(in_RDI + 9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1203c9);
  in_RDI[0xc] = local_20;
  in_RDI[0xd] = local_28;
  *(undefined1 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  TestResult::TestResult(this_01);
  return;
}

Assistant:

TestSuite::TestSuite(const char* a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}